

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_263068::ECCurveTest_Mul_Test::TestBody(ECCurveTest_Mul_Test *this)

{
  bool bVar1;
  EC_GROUP *pEVar2;
  pointer peVar3;
  char *pcVar4;
  BIGNUM *pBVar5;
  pointer peVar6;
  char *message;
  BIGNUM *m;
  char *in_R9;
  AssertHelper local_298;
  Message local_290;
  int local_288 [2];
  undefined1 local_280 [8];
  AssertionResult gtest_ar;
  AssertHelper local_250;
  Message local_248;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__7;
  EC_POINT *generator;
  AssertHelper local_200;
  Message local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<BIGNUM> n;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<EC_POINT> result;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EC_POINT> p;
  ECCurveTest_Mul_Test *this_local;
  
  pEVar2 = ECCurveTest::group(&this->super_ECCurveTest);
  peVar3 = (pointer)EC_POINT_new((EC_GROUP *)pEVar2);
  std::unique_ptr<ec_point_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)&gtest_ar_.message_,peVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ec_point_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x857c63,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,800,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    pEVar2 = ECCurveTest::group(&this->super_ECCurveTest);
    peVar3 = (pointer)EC_POINT_new((EC_GROUP *)pEVar2);
    std::unique_ptr<ec_point_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,peVar3);
    testing::AssertionResult::AssertionResult<std::unique_ptr<ec_point_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&n,(internal *)local_88,(AssertionResult *)0x855166,"false","true",in_R9)
      ;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0x322,pcVar4);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&n);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      pBVar5 = BN_new();
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (pointer)pBVar5);
      testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d0,(AssertionResult *)0x8f5f67,
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x324,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        pEVar2 = ECCurveTest::group(&this->super_ECCurveTest);
        peVar3 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
        ;
        local_114 = EC_POINT_set_to_infinity((EC_GROUP *)pEVar2,(EC_POINT *)peVar3);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_110,&local_114,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_110,
                     (AssertionResult *)"EC_POINT_set_to_infinity(group(), p.get())","false","true",
                     in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x325,pcVar4);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        if (bVar1) {
          pBVar5 = (BIGNUM *)
                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                              &gtest_ar__2.message_);
          local_15c = BN_set_word(pBVar5,10);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_158,&local_15c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_158,
                       (AssertionResult *)"BN_set_word(n.get(), 10)","false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x326,pcVar4);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
          if (bVar1) {
            pEVar2 = ECCurveTest::group(&this->super_ECCurveTest);
            peVar3 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            peVar6 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            pBVar5 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar__2.message_);
            pcVar4 = (char *)0x0;
            local_1a4 = EC_POINT_mul((EC_GROUP *)pEVar2,(EC_POINT *)peVar3,(BIGNUM *)0x0,
                                     (EC_POINT *)peVar6,pBVar5,(BN_CTX *)0x0);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1a0,&local_1a4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1a0,
                         (AssertionResult *)
                         "EC_POINT_mul(group(), result.get(), nullptr, p.get(), n.get(), nullptr)",
                         "false","true",pcVar4);
              message = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x32a,message);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
            if (bVar1) {
              pEVar2 = ECCurveTest::group(&this->super_ECCurveTest);
              peVar3 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
              local_1ec = EC_POINT_is_at_infinity((EC_GROUP *)pEVar2,(EC_POINT *)peVar3);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_1e8,&local_1ec,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
              if (!bVar1) {
                testing::Message::Message(&local_1f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&generator,(internal *)local_1e8,
                           (AssertionResult *)"EC_POINT_is_at_infinity(group(), result.get())",
                           "false","true",pcVar4);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_200,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x32b,pcVar4);
                testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper(&local_200);
                std::__cxx11::string::~string((string *)&generator);
                testing::Message::~Message(&local_1f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
              pEVar2 = ECCurveTest::group(&this->super_ECCurveTest);
              gtest_ar__7.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )EC_GROUP_get0_generator((EC_GROUP *)pEVar2);
              pEVar2 = ECCurveTest::group(&this->super_ECCurveTest);
              peVar3 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
              pBVar5 = BN_value_one();
              peVar6 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              m = (BIGNUM *)
                  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_
                            );
              pcVar4 = (char *)0x0;
              local_23c = EC_POINT_mul((EC_GROUP *)pEVar2,(EC_POINT *)peVar3,pBVar5,
                                       (EC_POINT *)peVar6,m,(BN_CTX *)0x0);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_238,&local_23c,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
              if (!bVar1) {
                testing::Message::Message(&local_248);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar.message_,(internal *)local_238,
                           (AssertionResult *)
                           "EC_POINT_mul(group(), result.get(), BN_value_one(), p.get(), n.get(), nullptr)"
                           ,"false","true",pcVar4);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_250,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x330,pcVar4);
                testing::internal::AssertHelper::operator=(&local_250,&local_248);
                testing::internal::AssertHelper::~AssertHelper(&local_250);
                std::__cxx11::string::~string((string *)&gtest_ar.message_);
                testing::Message::~Message(&local_248);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
              if (bVar1) {
                local_288[1] = 0;
                pEVar2 = ECCurveTest::group(&this->super_ECCurveTest);
                peVar3 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__1.message_);
                local_288[0] = EC_POINT_cmp((EC_GROUP *)pEVar2,(EC_POINT *)peVar3,
                                            (EC_POINT *)
                                            gtest_ar__7.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl,(BN_CTX *)0x0);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_280,"0",
                           "EC_POINT_cmp(group(), result.get(), generator, nullptr)",local_288 + 1,
                           local_288);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_280);
                if (!bVar1) {
                  testing::Message::Message(&local_290);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_298,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x331,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_298,&local_290);
                  testing::internal::AssertHelper::~AssertHelper(&local_298);
                  testing::Message::~Message(&local_290);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
              }
            }
          }
        }
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_P(ECCurveTest, Mul) {
  bssl::UniquePtr<EC_POINT> p(EC_POINT_new(group()));
  ASSERT_TRUE(p);
  bssl::UniquePtr<EC_POINT> result(EC_POINT_new(group()));
  ASSERT_TRUE(result);
  bssl::UniquePtr<BIGNUM> n(BN_new());
  ASSERT_TRUE(n);
  ASSERT_TRUE(EC_POINT_set_to_infinity(group(), p.get()));
  ASSERT_TRUE(BN_set_word(n.get(), 10));

  // First check that 10×∞ = ∞.
  ASSERT_TRUE(
      EC_POINT_mul(group(), result.get(), nullptr, p.get(), n.get(), nullptr));
  EXPECT_TRUE(EC_POINT_is_at_infinity(group(), result.get()));

  // Now check that 10×∞ + G = G.
  const EC_POINT *generator = EC_GROUP_get0_generator(group());
  ASSERT_TRUE(EC_POINT_mul(group(), result.get(), BN_value_one(), p.get(),
                           n.get(), nullptr));
  EXPECT_EQ(0, EC_POINT_cmp(group(), result.get(), generator, nullptr));
}